

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSampleShadingTests.cpp
# Opt level: O2

int __thiscall glcts::SampleShadingTests::init(SampleShadingTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  SampleShadingApiCaseGroup *this_00;
  SampleShadingRenderTests *this_01;
  
  this_00 = (SampleShadingApiCaseGroup *)operator_new(0x80);
  SampleShadingApiCaseGroup::SampleShadingApiCaseGroup
            (this_00,(this->super_TestCaseGroup).m_context,this->m_glslVersion);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (SampleShadingRenderTests *)operator_new(0x80);
  SampleShadingRenderTests::SampleShadingRenderTests
            (this_01,(this->super_TestCaseGroup).m_context,this->m_glslVersion);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  return extraout_EAX;
}

Assistant:

void SampleShadingTests::init(void)
{
	// sample_shading.api
	addChild(new SampleShadingApiCaseGroup(m_context, m_glslVersion));
	// sample_shading.render
	addChild(new SampleShadingRenderTests(m_context, m_glslVersion));
}